

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packingvectors.h
# Opt level: O2

uint32_t *
FastPForLib::packingvector<32U>::packmeuptightwithoutmask<unsigned_long>
          (unsigned_long *source,size_t size,uint32_t *out,uint32_t bit)

{
  uint uVar1;
  uint32_t *out_00;
  ulong uVar2;
  
  out_00 = out + 1;
  uVar1 = 0;
  *out = (uint32_t)size;
  while( true ) {
    uVar2 = (ulong)uVar1;
    if (size <= uVar2) break;
    fastpackwithoutmask(source + uVar2,out_00,bit);
    uVar1 = uVar1 + 0x20;
    out_00 = out_00 + bit;
  }
  return out_00 + -((ulong)bit * (uVar2 - size) >> 5);
}

Assistant:

static uint32_t *packmeuptightwithoutmask(
                                            const IntType * source,
                                            size_t size,
                                            uint32_t *out,
                                            const uint32_t bit) {
    *out = static_cast<uint32_t>(size);
    out++;
    uint32_t j = 0;
    for (; j < size; j += PACKSIZE) {
      fastpackwithoutmask(&source[j], out, bit);
      out += bit;
    }
    out -= (j - size) * bit / 32;
    return out;
  }